

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

bool __thiscall ExpressionContext::IsNumericType(ExpressionContext *this,TypeBase *type)

{
  bool bVar1;
  undefined4 in_ECX;
  int iVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(type == this->typeBool);
  auVar3._4_4_ = -(uint)(type == this->typeChar);
  auVar3._8_4_ = -(uint)(type == this->typeShort);
  auVar3._12_4_ = -(uint)(type == this->typeInt);
  iVar2 = movmskps(in_ECX,auVar3);
  bVar1 = true;
  if ((iVar2 == 0) && (this->typeLong != type)) {
    bVar1 = this->typeDouble == type || this->typeFloat == type;
  }
  return bVar1;
}

Assistant:

bool ExpressionContext::IsIntegerType(TypeBase* type)
{
	if(type == typeBool)
		return true;

	if(type == typeChar)
		return true;

	if(type == typeShort)
		return true;

	if(type == typeInt)
		return true;

	if(type == typeLong)
		return true;

	return false;
}